

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O3

Area * __thiscall SceneParser::parseArea(SceneParser *this)

{
  Material *m;
  Area *this_00;
  Vector3f sideTwo;
  Vector3f sideOne;
  Vector3f corner;
  char token [100];
  undefined1 local_9c [12];
  undefined1 local_90 [12];
  short local_78;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_71;
  
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (local_78 != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x177,"Area *SceneParser::parseArea()");
  }
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (_uStack_75 != 0x72656e || CONCAT13(uStack_75,CONCAT12(uStack_76,local_78)) != 0x6e726f63) {
    __assert_fail("!strcmp(token, \"corner\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x179,"Area *SceneParser::parseArea()");
  }
  readVector3f((SceneParser *)&stack0xffffffffffffff7c);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (CONCAT17(uStack_71,CONCAT43(_uStack_75,CONCAT12(uStack_76,local_78))) != 0x656e4f65646973) {
    __assert_fail("!strcmp(token, \"sideOne\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x17c,"Area *SceneParser::parseArea()");
  }
  readVector3f((SceneParser *)local_90);
  getToken(this,(char *)&stack0xffffffffffffff88);
  if (CONCAT17(uStack_71,CONCAT43(_uStack_75,CONCAT12(uStack_76,local_78))) == 0x6f775465646973) {
    readVector3f((SceneParser *)local_9c);
    getToken(this,(char *)&stack0xffffffffffffff88);
    if (local_78 != 0x7d) {
      __assert_fail("!strcmp(token, \"}\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                    ,0x182,"Area *SceneParser::parseArea()");
    }
    m = this->_current_material;
    if (m != (Material *)0x0) {
      this_00 = (Area *)operator_new(0x60);
      Area::Area(this_00,(Vector3f *)&stack0xffffffffffffff7c,(Vector3f *)local_90,
                 (Vector3f *)local_9c,m);
      return this_00;
    }
    __assert_fail("_current_material != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x183,"Area *SceneParser::parseArea()");
  }
  __assert_fail("!strcmp(token, \"sideTwo\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x17f,"Area *SceneParser::parseArea()");
}

Assistant:

Area *
SceneParser::parseArea() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "corner"));
    Vector3f corner = readVector3f();
    getToken(token);
    assert(!strcmp(token, "sideOne"));
    Vector3f sideOne = readVector3f();
    getToken(token);
    assert(!strcmp(token, "sideTwo"));
    Vector3f sideTwo = readVector3f();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    return new Area(corner, sideOne, sideTwo, _current_material);
}